

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstral_analysis.cc
# Opt level: O0

void __thiscall
sptk::MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis
          (MelGeneralizedCepstralAnalysis *this,int fft_length,int num_order,double alpha,
          double gamma,int num_iteration,double convergence_threshold)

{
  bool bVar1;
  void *pvVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  bool in_stack_0000010e;
  bool in_stack_0000010f;
  double in_stack_00000110;
  double in_stack_00000118;
  int in_stack_00000120;
  bool in_stack_00000126;
  bool in_stack_00000127;
  double in_stack_00000128;
  double in_stack_00000130;
  int in_stack_0000013c;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum *in_stack_00000140;
  int in_stack_ffffffffffffff4c;
  RealValuedInverseFastFourierTransform *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff61;
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  undefined8 *convergence_threshold_00;
  int num_iteration_00;
  undefined8 *puVar3;
  MelCepstralAnalysis *in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR__MelGeneralizedCepstralAnalysis_00146440;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  in_RDI[2] = in_XMM0_Qa;
  in_RDI[3] = in_XMM1_Qa;
  *(undefined4 *)(in_RDI + 4) = in_ECX;
  in_RDI[5] = CONCAT44(in_XMM2_Db,in_XMM2_Da);
  num_iteration_00 = (int)((ulong)(in_RDI + 6) >> 0x20);
  RealValuedFastFourierTransform::RealValuedFastFourierTransform
            ((RealValuedFastFourierTransform *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  puVar3 = in_RDI + 0x13;
  RealValuedInverseFastFourierTransform::RealValuedInverseFastFourierTransform
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  convergence_threshold_00 = in_RDI + 0x21;
  InverseFastFourierTransform::InverseFastFourierTransform
            ((InverseFastFourierTransform *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  ToeplitzPlusHankelSystemSolver::ToeplitzPlusHankelSystemSolver
            ((ToeplitzPlusHankelSystemSolver *)(in_RDI + 0x28),*(int *)((long)in_RDI + 0xc) + -1,
             true);
  GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
            ((GeneralizedCepstrumGainNormalization *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,
                                        CONCAT14(in_stack_ffffffffffffff64,
                                                 CONCAT13(in_stack_ffffffffffffff63,
                                                          CONCAT12(in_stack_ffffffffffffff62,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))),
             in_stack_ffffffffffffff5c,(double)in_stack_ffffffffffffff50);
  GeneralizedCepstrumInverseGainNormalization::GeneralizedCepstrumInverseGainNormalization
            ((GeneralizedCepstrumInverseGainNormalization *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,
                                        CONCAT14(in_stack_ffffffffffffff64,
                                                 CONCAT13(in_stack_ffffffffffffff63,
                                                          CONCAT12(in_stack_ffffffffffffff62,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))),
             in_stack_ffffffffffffff5c,(double)in_stack_ffffffffffffff50);
  GeneralizedCepstrumInverseGainNormalization::GeneralizedCepstrumInverseGainNormalization
            ((GeneralizedCepstrumInverseGainNormalization *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,
                                        CONCAT14(in_stack_ffffffffffffff64,
                                                 CONCAT13(in_stack_ffffffffffffff63,
                                                          CONCAT12(in_stack_ffffffffffffff62,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))),
             in_stack_ffffffffffffff5c,(double)in_stack_ffffffffffffff50);
  MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
            ((MelCepstrumToMlsaDigitalFilterCoefficients *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,
                                        CONCAT14(in_stack_ffffffffffffff64,
                                                 CONCAT13(in_stack_ffffffffffffff63,
                                                          CONCAT12(in_stack_ffffffffffffff62,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))),
             in_stack_ffffffffffffff5c,(double)in_stack_ffffffffffffff50);
  MlsaDigitalFilterCoefficientsToMelCepstrum::MlsaDigitalFilterCoefficientsToMelCepstrum
            ((MlsaDigitalFilterCoefficientsToMelCepstrum *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,
                                        CONCAT14(in_stack_ffffffffffffff64,
                                                 CONCAT13(in_stack_ffffffffffffff63,
                                                          CONCAT12(in_stack_ffffffffffffff62,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))),
             in_stack_ffffffffffffff5c,(double)in_stack_ffffffffffffff50);
  MelGeneralizedCepstrumToMelGeneralizedCepstrum::MelGeneralizedCepstrumToMelGeneralizedCepstrum
            (in_stack_00000140,in_stack_0000013c,in_stack_00000130,in_stack_00000128,
             in_stack_00000127,in_stack_00000126,in_stack_00000120,in_stack_00000118,
             in_stack_00000110,in_stack_0000010f,in_stack_0000010e);
  in_RDI[0x4b] = 0;
  *(undefined1 *)(in_RDI + 0x4c) = 1;
  bVar1 = IsValidGamma((double)in_RDI[3]);
  if ((((((!bVar1) || (0.0 < (double)in_RDI[3])) || (*(int *)(in_RDI + 4) < 0)) ||
       ((((double)in_RDI[5] <= 0.0 && (double)in_RDI[5] != 0.0 ||
         (bVar1 = RealValuedFastFourierTransform::IsValid
                            ((RealValuedFastFourierTransform *)(in_RDI + 6)), !bVar1)) ||
        ((bVar1 = RealValuedInverseFastFourierTransform::IsValid
                            ((RealValuedInverseFastFourierTransform *)0x10dc7b), !bVar1 ||
         (bVar1 = InverseFastFourierTransform::IsValid((InverseFastFourierTransform *)0x10dc9f),
         !bVar1)))))) ||
      ((bVar1 = ToeplitzPlusHankelSystemSolver::IsValid
                          ((ToeplitzPlusHankelSystemSolver *)(in_RDI + 0x28)), !bVar1 &&
       ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))))) ||
     ((bVar1 = GeneralizedCepstrumGainNormalization::IsValid
                         ((GeneralizedCepstrumGainNormalization *)(in_RDI + 0x2a)), !bVar1 ||
      ((((bVar1 = GeneralizedCepstrumInverseGainNormalization::IsValid
                            ((GeneralizedCepstrumInverseGainNormalization *)(in_RDI + 0x32)), !bVar1
         || (bVar1 = MelCepstrumToMlsaDigitalFilterCoefficients::IsValid
                               ((MelCepstrumToMlsaDigitalFilterCoefficients *)(in_RDI + 0x36)),
            !bVar1)) ||
        (bVar1 = MlsaDigitalFilterCoefficientsToMelCepstrum::IsValid
                           ((MlsaDigitalFilterCoefficientsToMelCepstrum *)(in_RDI + 0x3a)), !bVar1))
       || (bVar1 = MelGeneralizedCepstrumToMelGeneralizedCepstrum::IsValid
                             ((MelGeneralizedCepstrumToMelGeneralizedCepstrum *)(in_RDI + 0x3e)),
          !bVar1)))))) {
    *(undefined1 *)(in_RDI + 0x4c) = 0;
  }
  else if (((double)in_RDI[3] == 0.0) && (!NAN((double)in_RDI[3]))) {
    pvVar2 = operator_new(0x170);
    MelCepstralAnalysis::MelCepstralAnalysis
              (in_stack_ffffffffffffffc0,(int)((ulong)puVar3 >> 0x20),(int)puVar3,(double)in_RDI,
               num_iteration_00,(double)convergence_threshold_00);
    in_RDI[0x4b] = pvVar2;
  }
  return;
}

Assistant:

MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis(
    int fft_length, int num_order, double alpha, double gamma,
    int num_iteration, double convergence_threshold)
    : fft_length_(fft_length),
      num_order_(num_order),
      alpha_(alpha),
      gamma_(gamma),
      num_iteration_(num_iteration),
      convergence_threshold_(convergence_threshold),
      fourier_transform_(fft_length_),
      inverse_fourier_transform_(fft_length_),
      complex_valued_inverse_fourier_transform_(fft_length_),
      toeplitz_plus_hankel_system_solver_(num_order_ - 1, true),
      generalized_cepstrum_gain_normalization_(num_order_, gamma_),
      generalized_cepstrum_inverse_gain_normalization_gamma_minus_one_(
          num_order_, -1.0),
      generalized_cepstrum_inverse_gain_normalization_(num_order_, gamma_),
      mel_cepstrum_to_mlsa_digital_filter_coefficients_(num_order_, alpha_),
      mlsa_digital_filter_coefficients_to_mel_cepstrum_(num_order_, alpha_),
      mel_generalized_cepstrum_transform_(num_order_, 0.0, -1.0, false, false,
                                          num_order_, 0.0, gamma_, false,
                                          false),
      mel_cepstral_analysis_(NULL),
      is_valid_(true) {
  if (!sptk::IsValidGamma(gamma_) || 0.0 < gamma_ || num_iteration_ < 0 ||
      convergence_threshold_ < 0.0 || !fourier_transform_.IsValid() ||
      !inverse_fourier_transform_.IsValid() ||
      !complex_valued_inverse_fourier_transform_.IsValid() ||
      (!toeplitz_plus_hankel_system_solver_.IsValid() && 0.0 != gamma) ||
      !generalized_cepstrum_gain_normalization_.IsValid() ||
      !generalized_cepstrum_inverse_gain_normalization_.IsValid() ||
      !mel_cepstrum_to_mlsa_digital_filter_coefficients_.IsValid() ||
      !mlsa_digital_filter_coefficients_to_mel_cepstrum_.IsValid() ||
      !mel_generalized_cepstrum_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }

  if (0.0 == gamma_) {
    mel_cepstral_analysis_ = new MelCepstralAnalysis(
        fft_length_, num_order_, alpha_, num_iteration_, convergence_threshold);
  }
}